

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode Curl_req_send(Curl_easy *data,dynbuf *req)

{
  CURLcode CVar1;
  curl_off_t cVar2;
  size_t local_40;
  size_t nwritten;
  size_t blen;
  char *buf;
  dynbuf *pdStack_20;
  CURLcode result;
  dynbuf *req_local;
  Curl_easy *data_local;
  
  if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    pdStack_20 = req;
    req_local = (dynbuf *)data;
    blen = (size_t)Curl_dyn_ptr(req);
    nwritten = Curl_dyn_len(pdStack_20);
    cVar2 = Curl_creader_total_length((Curl_easy *)req_local);
    if (cVar2 == 0) {
      *(uint *)((long)&req_local[0xe].leng + 1) =
           *(uint *)((long)&req_local[0xe].leng + 1) & 0xffffffdf | 0x20;
      CVar1 = xfer_send((Curl_easy *)req_local,(char *)blen,nwritten,nwritten,&local_40);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      blen = local_40 + blen;
      nwritten = nwritten - local_40;
      buf._4_4_ = 0;
    }
    if (nwritten == 0) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      buf._4_4_ = req_send_buffer_add((Curl_easy *)req_local,(char *)blen,nwritten,nwritten);
      data_local._4_4_ = buf._4_4_;
      if (buf._4_4_ == CURLE_OK) {
        data_local._4_4_ = Curl_req_send_more((Curl_easy *)req_local);
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_req_send(struct Curl_easy *data, struct dynbuf *req)
{
  CURLcode result;
  const char *buf;
  size_t blen, nwritten;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;

  buf = Curl_dyn_ptr(req);
  blen = Curl_dyn_len(req);
  if(!Curl_creader_total_length(data)) {
    /* Request without body. Try to send directly from the buf given. */
    data->req.eos_read = TRUE;
    result = xfer_send(data, buf, blen, blen, &nwritten);
    if(result)
      return result;
    buf += nwritten;
    blen -= nwritten;
  }

  if(blen) {
    /* Either we have a request body, or we could not send the complete
     * request in one go. Buffer the remainder and try to add as much
     * body bytes as room is left in the buffer. Then flush. */
    result = req_send_buffer_add(data, buf, blen, blen);
    if(result)
      return result;

    return Curl_req_send_more(data);
  }
  return CURLE_OK;
}